

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O0

void __thiscall BVFixed::OrComplimented(BVFixed *this,BVFixed *bv)

{
  BVFixed *bv_local;
  BVFixed *this_local;
  
  AssertBV(this,bv);
  for_each<void(BVUnitT<unsigned_long>::*)(BVUnitT<unsigned_long>)>(this,bv,0x8dbc60);
  ClearEnd(this);
  return;
}

Assistant:

void
BVFixed::OrComplimented(const BVFixed*bv)
{
    AssertBV(bv);
    this->for_each(bv, &BVUnit::OrComplimented);
    ClearEnd();
}